

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

CURLUcode parse_authority(Curl_URL *u,char *auth,size_t authlen,uint flags,dynbuf *host,
                         _Bool has_scheme)

{
  Curl_URL *pCVar1;
  ulong uVar2;
  ulong uVar3;
  CURLcode CVar4;
  CURLUcode CVar5;
  void *pvVar6;
  Curl_handler *pCVar7;
  char *pcVar8;
  char *pcVar9;
  int *piVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  long lVar14;
  char **optionsp_00;
  ulong uVar15;
  undefined7 in_register_00000089;
  ulong uVar16;
  dynbuf *pdVar17;
  char *passwdp;
  char *optionsp;
  char *userp;
  char *local_88;
  Curl_URL *local_80;
  dynbuf *local_78;
  char *local_70;
  char *local_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  uint local_40;
  undefined4 local_3c;
  size_t local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000089,has_scheme);
  local_68 = (char *)0x0;
  local_88 = (char *)0x0;
  local_70 = (char *)0x0;
  local_78 = host;
  local_38 = authlen;
  pvVar6 = memchr(auth,0x40,authlen);
  CVar5 = CURLUE_OK;
  pcVar8 = (char *)0x0;
  if (pvVar6 == (void *)0x0) {
LAB_00161071:
    (*Curl_cfree)(pcVar8);
    (*Curl_cfree)(local_88);
    (*Curl_cfree)(local_70);
    u->user = (char *)0x0;
    u->password = (char *)0x0;
    u->options = (char *)0x0;
    if (pvVar6 != (void *)0x0) {
      return CVar5;
    }
    lVar14 = 0;
    pdVar17 = local_78;
  }
  else {
    local_80 = u;
    local_40 = flags;
    if (u->scheme == (char *)0x0) {
      lVar14 = (long)pvVar6 + (1 - (long)auth);
LAB_00161046:
      optionsp_00 = (char **)0x0;
    }
    else {
      pCVar7 = Curl_get_scheme_handler(u->scheme);
      lVar14 = (long)pvVar6 + (1 - (long)auth);
      if (pCVar7 == (Curl_handler *)0x0) goto LAB_00161046;
      optionsp_00 = &local_70;
      if ((pCVar7->flags & 0x400) == 0) {
        optionsp_00 = (char **)0x0;
      }
    }
    CVar4 = Curl_parse_login_details(auth,lVar14 - 1,&local_68,&local_88,optionsp_00);
    pCVar1 = local_80;
    CVar5 = CURLUE_BAD_LOGIN;
    pcVar8 = local_68;
    u = local_80;
    if (CVar4 != CURLE_OK) goto LAB_00161071;
    if (local_68 != (char *)0x0) {
      CVar5 = CURLUE_USER_NOT_ALLOWED;
      if ((local_40 & 0x20) != 0) goto LAB_00161071;
      (*Curl_cfree)(local_80->user);
      pCVar1->user = local_68;
    }
    u = local_80;
    if (local_88 != (char *)0x0) {
      (*Curl_cfree)(local_80->password);
      u->password = local_88;
    }
    pdVar17 = local_78;
    if (local_70 != (char *)0x0) {
      (*Curl_cfree)(u->options);
      u->options = local_70;
    }
  }
  CVar4 = Curl_dyn_addn(pdVar17,auth + lVar14,local_38 - lVar14);
  if (CVar4 != CURLE_OK) {
    if (CVar4 == CURLE_TOO_LARGE) {
      return CURLUE_TOO_LARGE;
    }
    return CURLUE_OUT_OF_MEMORY;
  }
  pcVar8 = Curl_dyn_ptr(pdVar17);
  if (*pcVar8 == '[') {
    pcVar9 = strchr(pcVar8,0x5d);
    if (pcVar9 == (char *)0x0) {
      return CURLUE_BAD_IPV6;
    }
    if (pcVar9[1] == '\0') goto LAB_0016127a;
    if (pcVar9[1] != ':') {
      return CURLUE_BAD_PORT_NUMBER;
    }
    pcVar9 = pcVar9 + 1;
    pdVar17 = local_78;
  }
  else {
    pcVar9 = strchr(pcVar8,0x3a);
    if (pcVar9 == (char *)0x0) goto LAB_0016127a;
  }
  local_68 = (char *)0x0;
  Curl_dyn_setlen(pdVar17,(long)pcVar9 - (long)pcVar8);
  if (pcVar9[1] == '\0') {
    if ((char)local_3c != '\0') {
LAB_0016127a:
      sVar12 = Curl_dyn_len(pdVar17);
      if (sVar12 == 0) {
        CVar5 = CURLUE_NO_HOST;
      }
      else {
        pcVar8 = Curl_dyn_ptr(pdVar17);
        local_58 = 0;
        uStack_50 = 0;
        local_68 = (char *)0x0;
        uStack_60 = 0;
        if (*pcVar8 == '[') {
          pcVar8 = Curl_dyn_ptr(pdVar17);
          sVar12 = Curl_dyn_len(pdVar17);
          CVar5 = ipv6_parse(u,pcVar8,sVar12);
        }
        else {
          local_80 = u;
          piVar10 = __errno_location();
          *piVar10 = 0;
          local_88 = (char *)0x0;
          if ((byte)(*pcVar8 - 0x30U) < 10) {
            uVar11 = 0;
            do {
              local_88 = (char *)0x0;
              pcVar8 = (char *)strtoul(pcVar8,&local_88,0);
              pcVar9 = local_88;
              if ((*piVar10 != 0) || ((ulong)pcVar8 >> 0x20 != 0)) break;
              (&local_68)[uVar11] = pcVar8;
              uVar3 = uStack_50;
              uVar16 = local_58;
              uVar2 = uStack_60;
              pcVar8 = local_68;
              if (*local_88 != '.') {
                if (*local_88 != '\0') break;
                switch(uVar11 & 0xffffffff) {
                case 0:
                  Curl_dyn_reset(pdVar17);
                  uVar13 = (ulong)local_68 >> 0x18;
                  uVar11 = (ulong)((uint)((ulong)local_68 >> 0x10) & 0xff);
                  uVar15 = (ulong)((uint)((ulong)local_68 >> 8) & 0xff);
                  uVar16 = (ulong)((uint)local_68 & 0xff);
                  break;
                case 1:
                  if (0xffffff < uStack_60 || (char *)0xff < local_68) goto LAB_001614a2;
                  Curl_dyn_reset(pdVar17);
                  uVar11 = uVar2 >> 0x10 & 0xffff;
                  uVar15 = (ulong)((uint)(uVar2 >> 8) & 0xff);
                  uVar13 = (ulong)pcVar8 & 0xffffffff;
                  uVar16 = (ulong)((uint)uVar2 & 0xff);
                  break;
                case 2:
                  if (0xffff < local_58 || (0xff < uStack_60 || (char *)0xff < local_68))
                  goto LAB_001614a2;
                  Curl_dyn_reset(pdVar17);
                  uVar15 = uVar16 >> 8 & 0xffffff;
                  uVar16 = uVar16 & 0xff;
                  uVar13 = (ulong)pcVar8 & 0xffffffff;
                  uVar11 = uVar2 & 0xffffffff;
                  break;
                case 3:
                  if ((0xff < uStack_50 || 0xff < local_58) ||
                      (0xff < uStack_60 || (char *)0xff < local_68)) goto LAB_001614a2;
                  Curl_dyn_reset(pdVar17);
                  uVar13 = (ulong)pcVar8 & 0xffffffff;
                  uVar11 = uVar2 & 0xffffffff;
                  uVar15 = uVar16 & 0xffffffff;
                  uVar16 = uVar3 & 0xffffffff;
                  break;
                default:
                  goto switchD_0016138b_default;
                }
                CVar4 = Curl_dyn_addf(pdVar17,"%u.%u.%u.%u",uVar13,uVar11,uVar15,uVar16);
                if (CVar4 != CURLE_OK) {
                  return CURLUE_OUT_OF_MEMORY;
                }
switchD_0016138b_default:
                return CURLUE_OK;
              }
              if (uVar11 == 3) break;
              uVar11 = uVar11 + 1;
              local_88 = (char *)0x0;
              pcVar8 = pcVar9 + 1;
            } while ((byte)(pcVar9[1] - 0x30U) < 10);
          }
LAB_001614a2:
          CVar5 = urldecode_host(pdVar17);
          pdVar17 = local_78;
          pCVar1 = local_80;
          if (CVar5 == CURLUE_OK) {
            pcVar8 = Curl_dyn_ptr(local_78);
            sVar12 = Curl_dyn_len(pdVar17);
            CVar5 = hostname_check(pCVar1,pcVar8,sVar12);
          }
        }
      }
      return CVar5;
    }
  }
  else if ((byte)(pcVar9[1] - 0x30U) < 10) {
    piVar10 = __errno_location();
    *piVar10 = 0;
    uVar11 = strtoul(pcVar9 + 1,&local_68,10);
    if (((*piVar10 == 0) && (uVar11 < 0x10000)) && (*local_68 == '\0')) {
      u->portnum = (unsigned_short)uVar11;
      (*Curl_cfree)(u->port);
      pcVar8 = curl_maprintf("%ld",uVar11);
      u->port = pcVar8;
      if (pcVar8 == (char *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      goto LAB_0016127a;
    }
  }
  return CURLUE_BAD_PORT_NUMBER;
}

Assistant:

static CURLUcode parse_authority(struct Curl_URL *u,
                                 const char *auth, size_t authlen,
                                 unsigned int flags,
                                 struct dynbuf *host,
                                 bool has_scheme)
{
  size_t offset;
  CURLUcode uc;
  CURLcode result;

  /*
   * Parse the login details and strip them out of the hostname.
   */
  uc = parse_hostname_login(u, auth, authlen, flags, &offset);
  if(uc)
    goto out;

  result = Curl_dyn_addn(host, auth + offset, authlen - offset);
  if(result) {
    uc = cc2cu(result);
    goto out;
  }

  uc = Curl_parse_port(u, host, has_scheme);
  if(uc)
    goto out;

  if(!Curl_dyn_len(host))
    return CURLUE_NO_HOST;

  switch(ipv4_normalize(host)) {
  case HOST_IPV4:
    break;
  case HOST_IPV6:
    uc = ipv6_parse(u, Curl_dyn_ptr(host), Curl_dyn_len(host));
    break;
  case HOST_NAME:
    uc = urldecode_host(host);
    if(!uc)
      uc = hostname_check(u, Curl_dyn_ptr(host), Curl_dyn_len(host));
    break;
  case HOST_ERROR:
    uc = CURLUE_OUT_OF_MEMORY;
    break;
  default:
    uc = CURLUE_BAD_HOSTNAME; /* Bad IPv4 address even */
    break;
  }

out:
  return uc;
}